

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O1

int Ivy_FastMapNodeAreaDerefed(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = *(uint *)&pObj->field_0x8 & 0xf;
  iVar2 = 0;
  if ((uVar3 != 1) && (iVar2 = 0, uVar3 != 4)) {
    if (uVar3 - 7 < 0xfffffffe) {
      __assert_fail("Ivy_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                    ,0x42e,"int Ivy_FastMapNodeAreaDerefed(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    if (*(int *)(*(long *)((long)pAig->pData + 0x10) + 4 +
                (long)*(int *)((long)pAig->pData + 8) * (long)pObj->Id) != 0) {
      __assert_fail("pSupp->nRefs == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                    ,0x430,"int Ivy_FastMapNodeAreaDerefed(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    iVar1 = Ivy_FastMapNodeRef(pAig,pObj);
    iVar2 = Ivy_FastMapNodeDeref(pAig,pObj);
    if (iVar2 != iVar1) {
      __assert_fail("aResult == aResult2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                    ,0x433,"int Ivy_FastMapNodeAreaDerefed(Ivy_Man_t *, Ivy_Obj_t *)");
    }
  }
  return iVar2;
}

Assistant:

int Ivy_FastMapNodeAreaDerefed( Ivy_Man_t * pAig, Ivy_Obj_t * pObj )
{
    Ivy_Supp_t * pSupp;
    int aResult, aResult2;
    if ( Ivy_ObjIsCi(pObj) )
        return 0;
    assert( Ivy_ObjIsNode(pObj) );
    pSupp = Ivy_ObjSupp( pAig, pObj );
    assert( pSupp->nRefs == 0 );
    aResult2 = Ivy_FastMapNodeRef( pAig, pObj );
    aResult  = Ivy_FastMapNodeDeref( pAig, pObj );
    assert( aResult == aResult2 );
    return aResult;
}